

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O0

void __thiscall gmlc::networking::AsioContextManager::~AsioContextManager(AsioContextManager *this)

{
  undefined1 uVar1;
  bool bVar2;
  mutex_type *in_RDI;
  pointer val;
  lock_guard<std::mutex> nullLock;
  undefined7 in_stack_ffffffffffffffd0;
  
  (in_RDI->super___mutex_base)._M_mutex.__align = (long)&PTR__AsioContextManager_00a8d2b0;
  uVar1 = isRunning((AsioContextManager *)0x7bf515);
  if ((bool)uVar1) {
    CLI::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)CONCAT17(uVar1,in_stack_ffffffffffffffd0),in_RDI);
    std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::reset
              ((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffffd0),(pointer)in_RDI);
    std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator->
              ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)0x7bf55a);
    ::asio::io_context::stop((io_context *)0x7bf562);
    std::shared_future<void>::get((shared_future<void> *)0x7bf574);
    CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x7bf580);
  }
  else {
    bVar2 = std::__basic_future<void>::valid((__basic_future<void> *)0x7bf5cf);
    if (bVar2) {
      std::shared_future<void>::get((shared_future<void> *)0x7bf5e5);
    }
  }
  if ((in_RDI[2].super___mutex_base._M_mutex.__size[0] & 1U) != 0) {
    std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::release
              ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)0x7bf602);
  }
  std::shared_future<void>::~shared_future((shared_future<void> *)0x7bf617);
  std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::~unique_ptr
            ((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffd0));
  std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::~unique_ptr
            ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffd0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffd0));
  std::enable_shared_from_this<gmlc::networking::AsioContextManager>::~enable_shared_from_this
            ((enable_shared_from_this<gmlc::networking::AsioContextManager> *)0x7bf64b);
  return;
}

Assistant:

AsioContextManager::~AsioContextManager()
{
    //  std::cout << "deleting context manager\n";

    if (isRunning()) {
        try {
            std::lock_guard<std::mutex> nullLock(runningLoopLock);
            nullwork.reset();
            ictx->stop();
            loopRet.get();
        }
        catch (...) {
        }
    } else if (loopRet.valid()) {
        loopRet.get();
    }
    if (leakOnDelete) {
        // yes I am purposefully leaking this PHILIP TOP
        // this capability is needed for some operations on particular OS's with
        // the shared library operations that will crash if this is closed
        // before the library closes which really only happens at program
        // termination
        auto val = ictx.release();
        (void)(val);
    }
}